

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O3

bool common::WriteSettings
               (path *path,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
               *values,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *errors)

{
  uint uVar1;
  pointer pcVar2;
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  _Base_ptr p_Var3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Rb_tree_header *p_Var5;
  long in_FS_OFFSET;
  ofstream file;
  SettingsValue out;
  undefined8 in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined1 *puVar6;
  undefined8 in_stack_fffffffffffffc28;
  long in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  _Alloc_hider in_stack_fffffffffffffc40;
  _Alloc_hider in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  pointer in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  uint auStack_380 [54];
  ios_base local_2a8 [264];
  _Rb_tree_color local_1a0;
  long *local_198 [2];
  long local_188 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<UniValue,_std::allocator<UniValue>_> local_160;
  long *local_148 [2];
  long local_138 [2];
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90.val._M_dataplus._M_p = (pointer)&local_90.val.field_2;
  local_90.typ = VOBJ;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
  local_90.val.field_2._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_90.val._M_string_length = 0;
  local_a8 = 0;
  local_a0[0] = 0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,(anonymous_namespace)::SETTINGS_WARN_MSG_KEY_abi_cxx11_,
             DAT_001e9970 + (anonymous_namespace)::SETTINGS_WARN_MSG_KEY_abi_cxx11_);
  tinyformat::format<char[13]>
            ((string *)&stack0xfffffffffffffc60,
             "This file is automatically generated and updated by %s. Please do not edit this file while the node is running, as any changes might be ignored or overwritten."
             ,(char (*) [13])"Bitcoin Core");
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffc60);
  key._M_string_length = in_stack_fffffffffffffc10;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
  key.field_2._M_allocated_capacity = in_stack_fffffffffffffc18;
  key.field_2._8_8_ = in_stack_fffffffffffffc20;
  val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc30;
  val._0_8_ = in_stack_fffffffffffffc28;
  val.val._M_string_length = in_stack_fffffffffffffc38;
  val.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc40._M_p;
  val.val.field_2._8_8_ = in_stack_fffffffffffffc48._M_p;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc50;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc58;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc60;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffc68;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffc70;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_fffffffffffffc78;
  UniValue::pushKV(&local_90,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
    operator_delete(local_128.val._M_dataplus._M_p,local_128.val.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)in_stack_fffffffffffffc60 != &stack0xfffffffffffffc70) {
    operator_delete((void *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc70 + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  p_Var3 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(values->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      local_148[0] = local_138;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_148,*(long *)(p_Var3 + 1),
                 (long)&(p_Var3[1]._M_parent)->_M_color + *(long *)(p_Var3 + 1));
      local_1a0 = p_Var3[2]._M_color;
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,p_Var3[2]._M_parent,
                 (long)&(p_Var3[2]._M_parent)->_M_color + (long)&(p_Var3[2]._M_left)->_M_color);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_178,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var3[3]._M_parent);
      std::vector<UniValue,_std::allocator<UniValue>_>::vector
                (&local_160,(vector<UniValue,_std::allocator<UniValue>_> *)(p_Var3 + 4));
      key_00._M_string_length = (size_type)errors;
      key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc08;
      key_00.field_2._M_allocated_capacity = (size_type)path;
      key_00.field_2._8_8_ = in_stack_fffffffffffffc20;
      val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc30;
      val_00._0_8_ = in_stack_fffffffffffffc28;
      val_00.val._M_string_length = in_stack_fffffffffffffc38;
      val_00.val.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffc40._M_p;
      val_00.val.field_2._8_8_ = in_stack_fffffffffffffc48._M_p;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc50;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc58;
      val_00.keys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc60;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffc68;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffc70;
      val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffc78;
      UniValue::pushKVEnd(&local_90,key_00,val_00);
      std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_178);
      if (local_198[0] != local_188) {
        operator_delete(local_198[0],local_188[0] + 1);
      }
      if (local_148[0] != local_138) {
        operator_delete(local_148[0],local_138[0] + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  std::ofstream::ofstream(&stack0xfffffffffffffc60);
  std::ofstream::open(&stack0xfffffffffffffc60,
                      (_Ios_Openmode)(path->super_path)._M_pathname._M_dataplus._M_p);
  uVar1 = *(uint *)((long)auStack_380 + *(long *)(in_stack_fffffffffffffc60 + -0x18));
  if ((uVar1 & 5) == 0) {
    UniValue::write_abi_cxx11_((UniValue *)&stack0xfffffffffffffc40,(int)&local_90,(void *)0x4,1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&stack0xfffffffffffffc60,in_stack_fffffffffffffc40._M_p,
                        (long)in_stack_fffffffffffffc48._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (in_stack_fffffffffffffc40._M_p != &stack0xfffffffffffffc50) {
      operator_delete(in_stack_fffffffffffffc40._M_p,in_stack_fffffffffffffc50 + 1);
    }
    std::ofstream::close();
  }
  else {
    pcVar2 = (path->super_path)._M_pathname._M_dataplus._M_p;
    puVar6 = &stack0xfffffffffffffc30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffc20,pcVar2,
               pcVar2 + (path->super_path)._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string>
              ((string *)&stack0xfffffffffffffc40,
               (tinyformat *)"Error: Unable to open settings file %s for writing",
               &stack0xfffffffffffffc20,args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffc40);
    if (in_stack_fffffffffffffc40._M_p != &stack0xfffffffffffffc50) {
      operator_delete(in_stack_fffffffffffffc40._M_p,in_stack_fffffffffffffc50 + 1);
    }
    if (puVar6 != &stack0xfffffffffffffc30) {
      operator_delete(puVar6,in_stack_fffffffffffffc30 + 1);
    }
  }
  *(undefined8 *)((long)auStack_380 + *(long *)(_VTT + -0x18) + -0x20) = __M_insert<void_const*>;
  std::filebuf::~filebuf((filebuf *)&stack0xfffffffffffffc68);
  std::ios_base::~ios_base(local_2a8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (uVar1 & 5) == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool WriteSettings(const fs::path& path,
    const std::map<std::string, SettingsValue>& values,
    std::vector<std::string>& errors)
{
    SettingsValue out(SettingsValue::VOBJ);
    // Add auto-generated warning comment
    out.pushKV(SETTINGS_WARN_MSG_KEY, strprintf("This file is automatically generated and updated by %s. Please do not edit this file while the node "
                                                "is running, as any changes might be ignored or overwritten.", PACKAGE_NAME));
    // Push settings values
    for (const auto& value : values) {
        out.pushKVEnd(value.first, value.second);
    }
    std::ofstream file;
    file.open(path);
    if (file.fail()) {
        errors.emplace_back(strprintf("Error: Unable to open settings file %s for writing", fs::PathToString(path)));
        return false;
    }
    file << out.write(/* prettyIndent= */ 4, /* indentLevel= */ 1) << std::endl;
    file.close();
    return true;
}